

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 SyStrncmp(char *zLeft,char *zRight,sxu32 nLen)

{
  byte *pbVar1;
  sxu32 sVar2;
  long lVar3;
  uchar *zQ;
  uchar *zP;
  byte bVar4;
  
  if (zLeft != (char *)0x0) {
    if (zRight != (char *)0x0 && *zLeft != '\0') {
      if (*zRight == '\0') {
        return 1;
      }
      if (nLen == 0) {
        return 0;
      }
      lVar3 = 0;
      pbVar1 = (byte *)zRight;
      do {
        sVar2 = (sxu32)lVar3;
        if (nLen == sVar2) {
          return 0;
        }
        bVar4 = zLeft[lVar3];
        if (bVar4 == 0) {
LAB_0012efe1:
          bVar4 = 0;
LAB_0012efe4:
          return (uint)bVar4 - (uint)*pbVar1;
        }
        if (bVar4 != zRight[lVar3]) {
          pbVar1 = (byte *)(zRight + lVar3);
          goto LAB_0012efe4;
        }
        if (nLen - 1 == sVar2) {
          return 0;
        }
        bVar4 = zLeft[lVar3 + 1];
        if (bVar4 == 0) {
          pbVar1 = (byte *)(zRight + lVar3 + 1);
          goto LAB_0012efe1;
        }
        if (bVar4 != zRight[lVar3 + 1]) {
          pbVar1 = pbVar1 + 1;
          goto LAB_0012efe4;
        }
        if (nLen - 2 == sVar2) {
          return 0;
        }
        bVar4 = zLeft[lVar3 + 2];
        if (bVar4 == 0) {
          pbVar1 = pbVar1 + 2;
          goto LAB_0012efe1;
        }
        if (bVar4 != zRight[lVar3 + 2]) {
          pbVar1 = (byte *)(zRight + lVar3 + 2);
          goto LAB_0012efe4;
        }
        if (nLen - 3 == sVar2) {
          return 0;
        }
        bVar4 = zLeft[lVar3 + 3];
        if (bVar4 == 0) {
          pbVar1 = (byte *)(zRight + lVar3 + 3);
          goto LAB_0012efe1;
        }
        if (bVar4 != zRight[lVar3 + 3]) {
          pbVar1 = pbVar1 + 3;
          goto LAB_0012efe4;
        }
        pbVar1 = pbVar1 + 4;
        lVar3 = lVar3 + 4;
      } while( true );
    }
    if (*zLeft != '\0') {
      return 1;
    }
  }
  if (zRight != (char *)0x0) {
    return -(uint)(*zRight != '\0');
  }
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 SyStrncmp(const char *zLeft, const char *zRight, sxu32 nLen)
{
	const unsigned char *zP = (const unsigned char *)zLeft;
	const unsigned char *zQ = (const unsigned char *)zRight;

	if( SX_EMPTY_STR(zP) || SX_EMPTY_STR(zQ)  ){
			return SX_EMPTY_STR(zP) ? (SX_EMPTY_STR(zQ) ? 0 : -1) :1;
	}
	if( nLen <= 0 ){
		return 0;
	}
	for(;;){
		if( nLen <= 0 ){ return 0; } if( zP[0] == 0 || zQ[0] == 0 || zP[0] != zQ[0] ){ break; } zP++; zQ++; nLen--;
		if( nLen <= 0 ){ return 0; } if( zP[0] == 0 || zQ[0] == 0 || zP[0] != zQ[0] ){ break; } zP++; zQ++; nLen--;
		if( nLen <= 0 ){ return 0; } if( zP[0] == 0 || zQ[0] == 0 || zP[0] != zQ[0] ){ break; } zP++; zQ++; nLen--;
		if( nLen <= 0 ){ return 0; } if( zP[0] == 0 || zQ[0] == 0 || zP[0] != zQ[0] ){ break; } zP++; zQ++; nLen--;
	}
	return (sxi32)(zP[0] - zQ[0]);
}